

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void unhexFunc(sqlite3_context *pCtx,int argc,sqlite3_value **argv)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  u32 uVar5;
  u32 uVar6;
  byte *pbVar7;
  uchar *puVar8;
  byte *z;
  long lVar9;
  byte *pbVar10;
  long in_FS_OFFSET;
  byte *local_48;
  uchar *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar7 = (byte *)sqlite3ValueText(*argv,'\x01');
  local_48 = pbVar7;
  iVar3 = sqlite3ValueBytes(*argv,'\x01');
  if (argc == 2) {
    puVar8 = (uchar *)sqlite3ValueText(argv[1],'\x01');
    iVar4 = sqlite3ValueBytes(argv[1],'\x01');
    lVar9 = (long)iVar4;
  }
  else {
    puVar8 = "";
    lVar9 = 0;
  }
  if (puVar8 == (uchar *)0x0 || pbVar7 == (byte *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    z = (byte *)contextMalloc(pCtx,(long)(iVar3 / 2 + 1));
    if (z == (byte *)0x0) {
      pbVar10 = (byte *)0x0;
    }
    else {
      bVar2 = *pbVar7;
      pbVar10 = z;
      if (bVar2 != 0) {
        do {
          while (uVar5 = (u32)bVar2, (""[bVar2] & 8) != 0) {
            local_48 = pbVar7 + 2;
            bVar1 = pbVar7[1];
            if ((""[bVar1] & 8) == 0) {
LAB_001af73b:
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                sqlite3_free(z);
                return;
              }
              goto LAB_001af79e;
            }
            *pbVar10 = ((char)(bVar1 * '\x02') >> 7 & 9U) + bVar1 & 0xf |
                       (((char)(bVar2 * '\x02') >> 7 & 9U) + bVar2) * '\x10';
            pbVar10 = pbVar10 + 1;
            bVar2 = *local_48;
            pbVar7 = local_48;
            if (bVar2 == 0) goto LAB_001af764;
          }
          if ((char)bVar2 < '\0') {
            uVar5 = sqlite3Utf8Read(&local_48);
            local_40 = puVar8;
          }
          else {
            local_48 = pbVar7 + 1;
            local_40 = puVar8;
          }
          do {
            if (puVar8 + lVar9 <= local_40) goto LAB_001af73b;
            uVar6 = (u32)(char)*local_40;
            if ((char)*local_40 < '\0') {
              uVar6 = sqlite3Utf8Read(&local_40);
            }
            else {
              local_40 = local_40 + 1;
            }
          } while (uVar6 != uVar5);
          bVar2 = *local_48;
          pbVar7 = local_48;
        } while (bVar2 != 0);
      }
    }
LAB_001af764:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      setResultStrOrError(pCtx,(char *)z,(int)pbVar10 - (int)z,'\0',sqlite3_free);
      return;
    }
  }
LAB_001af79e:
  __stack_chk_fail();
}

Assistant:

static void unhexFunc(
  sqlite3_context *pCtx,
  int argc,
  sqlite3_value **argv
){
  const u8 *zPass = (const u8*)"";
  int nPass = 0;
  const u8 *zHex = sqlite3_value_text(argv[0]);
  int nHex = sqlite3_value_bytes(argv[0]);
#ifdef SQLITE_DEBUG
  const u8 *zEnd = zHex ? &zHex[nHex] : 0;
#endif
  u8 *pBlob = 0;
  u8 *p = 0;

  assert( argc==1 || argc==2 );
  if( argc==2 ){
    zPass = sqlite3_value_text(argv[1]);
    nPass = sqlite3_value_bytes(argv[1]);
  }
  if( !zHex || !zPass ) return;

  p = pBlob = contextMalloc(pCtx, (nHex/2)+1);
  if( pBlob ){
    u8 c;                         /* Most significant digit of next byte */
    u8 d;                         /* Least significant digit of next byte */

    while( (c = *zHex)!=0x00 ){
      while( !sqlite3Isxdigit(c) ){
        u32 ch = Utf8Read(zHex);
        assert( zHex<=zEnd );
        if( !strContainsChar(zPass, nPass, ch) ) goto unhex_null;
        c = *zHex;
        if( c==0x00 ) goto unhex_done;
      }
      zHex++;
      assert( *zEnd==0x00 );
      assert( zHex<=zEnd );
      d = *(zHex++);
      if( !sqlite3Isxdigit(d) ) goto unhex_null;
      *(p++) = (sqlite3HexToInt(c)<<4) | sqlite3HexToInt(d);
    }
  }

 unhex_done:
  sqlite3_result_blob(pCtx, pBlob, (p - pBlob), sqlite3_free);
  return;

 unhex_null:
  sqlite3_free(pBlob);
  return;
}